

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonNumber.h
# Opt level: O2

string * __thiscall
Json::JsonNumber::toString_abi_cxx11_(string *__return_storage_ptr__,JsonNumber *this)

{
  ostringstream ost;
  ostringstream local_190 [376];
  
  if (this->__flag == true) {
    std::__cxx11::to_string(__return_storage_ptr__,this->__In);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::_M_insert<double>(this->__Dn);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() override {
            if (__flag) return std::to_string(__In);
            std::ostringstream ost;
            ost << __Dn;
            return ost.str();
        }